

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  OPJ_INT32 *pOVar3;
  uint uVar4;
  FILE *pFVar5;
  OPJ_INT32 **ppOVar6;
  size_t sVar7;
  undefined8 uVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  OPJ_UINT32 *pOVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  int iVar19;
  uint *puVar20;
  uint local_88;
  int local_70;
  int local_6c;
  uint *local_68;
  uint *local_60;
  
  poVar2 = image->comps;
  OVar1 = poVar2->prec;
  pcVar18 = outfile;
  if ((int)OVar1 < 0x11) {
    do {
      pcVar9 = pcVar18;
      pcVar18 = pcVar9 + 1;
    } while (*pcVar9 != '\0');
    uVar14 = image->numcomps;
    uVar12 = 1;
    if ((pcVar9[-2] & 0xdfU) != 0x47) {
      uVar12 = (ulong)uVar14;
    }
    local_88 = (uint)uVar12;
    if ((force_split == 0) && (1 < local_88)) {
      if (1 < uVar14) {
        pOVar13 = &poVar2[1].sgnd;
        uVar16 = 1;
        do {
          if (((poVar2->dx != ((opj_image_comp_t *)(pOVar13 + -8))->dx) ||
              (poVar2->dy != pOVar13[-7])) ||
             ((uVar16 < 3 && ((OVar1 != pOVar13[-2] || (poVar2->sgnd != *pOVar13))))))
          goto LAB_00109490;
          uVar16 = uVar16 + 1;
          pOVar13 = pOVar13 + 0x10;
        } while (uVar14 != uVar16);
      }
      pFVar5 = fopen(outfile,"wb");
      if (pFVar5 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
      }
      else {
        poVar2 = image->comps;
        pOVar3 = poVar2->data;
        if (pOVar3 != (OPJ_INT32 *)0x0) {
          uVar14 = poVar2->w;
          uVar4 = poVar2->h;
          if (local_88 < 3) {
            local_60 = (uint *)0x0;
            local_68 = (uint *)0x0;
          }
          else {
            ppOVar6 = &poVar2[1].data;
            local_68 = (uint *)poVar2[1].data;
            local_60 = (uint *)poVar2[2].data;
            lVar17 = 1;
            do {
              if (*ppOVar6 == (OPJ_INT32 *)0x0) {
                imagetopnm_cold_4();
                return 1;
              }
              lVar17 = lVar17 + 1;
              ppOVar6 = ppOVar6 + 8;
            } while (lVar17 != 3);
          }
          uVar11 = ~(-1 << ((byte)OVar1 & 0x1f));
          if ((local_88 == 4) || (local_88 == 2)) {
            pcVar18 = "GRAYSCALE_ALPHA";
            if (2 < local_88) {
              pcVar18 = "RGB_ALPHA";
            }
            uVar8 = opj_version();
            fprintf(pFVar5,
                    "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                    ,uVar8,(ulong)uVar14,(ulong)uVar4,uVar12,(ulong)uVar11,pcVar18);
            poVar2 = image->comps;
            uVar11 = local_88 - 1;
            puVar20 = (uint *)poVar2[uVar11].data;
            if (poVar2[uVar11].sgnd == 0) {
              iVar19 = 0;
            }
            else {
              iVar19 = 1 << ((char)poVar2[uVar11].prec - 1U & 0x1f);
            }
          }
          else {
            uVar8 = opj_version();
            iVar19 = 0;
            fprintf(pFVar5,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar8,(ulong)uVar14,(ulong)uVar4,
                    (ulong)uVar11);
            puVar20 = (uint *)0x0;
          }
          poVar2 = image->comps;
          local_6c = 0;
          iVar10 = 0;
          if (poVar2->sgnd != 0) {
            iVar10 = 1 << ((char)poVar2->prec - 1U & 0x1f);
          }
          local_70 = 0;
          if (2 < local_88) {
            local_70 = 0;
            local_6c = 0;
            if (poVar2[1].sgnd != 0) {
              local_6c = 1 << ((char)poVar2[1].prec - 1U & 0x1f);
            }
            if (poVar2[2].sgnd != 0) {
              local_70 = 1 << ((char)poVar2[2].prec - 1U & 0x1f);
            }
          }
          if (0 < (int)(uVar4 * uVar14)) {
            lVar17 = 0;
            do {
              uVar11 = pOVar3[lVar17];
              if ((int)OVar1 < 9) {
                uVar15 = 0;
                if (0 < (int)uVar11) {
                  uVar15 = uVar11;
                }
                uVar15 = uVar15 & 0xff;
                if (0xff < (int)uVar11) {
                  uVar15 = 0xff;
                }
                fputc(uVar15,pFVar5);
                if (2 < local_88) {
                  uVar11 = *local_68;
                  local_68 = local_68 + 1;
                  uVar15 = 0;
                  if (0 < (int)uVar11) {
                    uVar15 = uVar11;
                  }
                  uVar15 = uVar15 & 0xff;
                  if (0xff < (int)uVar11) {
                    uVar15 = 0xff;
                  }
                  fputc(uVar15,pFVar5);
                  uVar11 = *local_60;
                  local_60 = local_60 + 1;
                  uVar15 = 0;
                  if (0 < (int)uVar11) {
                    uVar15 = uVar11;
                  }
                  uVar15 = uVar15 & 0xff;
                  if (0xff < (int)uVar11) {
                    uVar15 = 0xff;
                  }
                  fputc(uVar15,pFVar5);
                }
                if ((local_88 == 4) || (local_88 == 2)) {
                  uVar11 = *puVar20;
                  puVar20 = puVar20 + 1;
                  uVar15 = 0;
                  if (0 < (int)uVar11) {
                    uVar15 = uVar11;
                  }
                  uVar15 = uVar15 & 0xff;
                  if (0xff < (int)uVar11) {
                    uVar15 = 0xff;
                  }
                  fputc(uVar15,pFVar5);
                }
              }
              else {
                uVar11 = uVar11 + iVar10;
                if ((int)uVar11 < 1) {
                  uVar11 = 0;
                }
                if (0xfffe < (int)uVar11) {
                  uVar11 = 0xffff;
                }
                fprintf(pFVar5,"%c%c",(ulong)(uVar11 >> 8));
                if (2 < local_88) {
                  uVar11 = *local_68 + local_6c;
                  local_68 = local_68 + 1;
                  if ((int)uVar11 < 1) {
                    uVar11 = 0;
                  }
                  if (0xfffe < (int)uVar11) {
                    uVar11 = 0xffff;
                  }
                  fprintf(pFVar5,"%c%c",(ulong)(uVar11 >> 8),(ulong)(uVar11 & 0xff));
                  uVar11 = *local_60 + local_70;
                  local_60 = local_60 + 1;
                  if ((int)uVar11 < 1) {
                    uVar11 = 0;
                  }
                  if (0xfffe < (int)uVar11) {
                    uVar11 = 0xffff;
                  }
                  fprintf(pFVar5,"%c%c",(ulong)(uVar11 >> 8));
                }
                if ((local_88 == 4) || (local_88 == 2)) {
                  uVar11 = *puVar20 + iVar19;
                  puVar20 = puVar20 + 1;
                  if ((int)uVar11 < 1) {
                    uVar11 = 0;
                  }
                  uVar12 = (ulong)uVar11;
                  if (0xfffe < (int)uVar11) {
                    uVar12 = 0xffff;
                  }
                  fprintf(pFVar5,"%c%c",uVar12 >> 8);
                }
              }
              lVar17 = lVar17 + 1;
            } while (uVar4 * uVar14 != (int)lVar17);
          }
          fclose(pFVar5);
          return 0;
        }
        imagetopnm_cold_5();
      }
    }
    else {
LAB_00109490:
      if (local_88 < uVar14) {
        imagetopnm_cold_1();
      }
      sVar7 = strlen(outfile);
      pcVar18 = (char *)malloc(sVar7 + 8);
      if (pcVar18 != (char *)0x0) {
        if (local_88 != 0) {
          uVar16 = 0;
          do {
            if (local_88 < 2) {
              strcpy(pcVar18,outfile);
            }
            else {
              sVar7 = strlen(outfile);
              memcpy(pcVar18,outfile,sVar7 - 4);
              sprintf(pcVar18 + (sVar7 - 4),"_%u.pgm",uVar16 & 0xffffffff);
            }
            pFVar5 = fopen(pcVar18,"wb");
            if (pFVar5 == (FILE *)0x0) {
              imagetopnm_cold_2();
              return 1;
            }
            poVar2 = image->comps;
            uVar14 = poVar2[uVar16].w;
            uVar4 = poVar2[uVar16].h;
            OVar1 = poVar2[uVar16].prec;
            uVar8 = opj_version();
            fprintf(pFVar5,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar8,(ulong)uVar14,(ulong)uVar4,
                    (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
            poVar2 = image->comps;
            pOVar3 = poVar2[uVar16].data;
            if (pOVar3 != (OPJ_INT32 *)0x0) {
              if (poVar2[uVar16].sgnd == 0) {
                iVar19 = 0;
              }
              else {
                iVar19 = 1 << ((char)poVar2[uVar16].prec - 1U & 0x1f);
              }
              iVar10 = uVar4 * uVar14;
              if ((int)OVar1 < 9) {
                if (0 < iVar10) {
                  lVar17 = 0;
                  do {
                    uVar4 = pOVar3[lVar17] + iVar19;
                    uVar14 = 0;
                    if (0 < (int)uVar4) {
                      uVar14 = uVar4;
                    }
                    uVar14 = uVar14 & 0xff;
                    if (0xff < (int)uVar4) {
                      uVar14 = 0xff;
                    }
                    fputc(uVar14,pFVar5);
                    lVar17 = lVar17 + 1;
                  } while (iVar10 != (int)lVar17);
                }
              }
              else if (0 < iVar10) {
                lVar17 = 0;
                do {
                  uVar14 = pOVar3[lVar17] + iVar19;
                  if (pOVar3[lVar17] + iVar19 < 1) {
                    uVar14 = 0;
                  }
                  if (0xfffe < (int)uVar14) {
                    uVar14 = 0xffff;
                  }
                  fprintf(pFVar5,"%c%c",(ulong)(uVar14 >> 8),(ulong)uVar14 & 0xff);
                  lVar17 = lVar17 + 1;
                } while (iVar10 != (int)lVar17);
              }
            }
            fclose(pFVar5);
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar12);
        }
        free(pcVar18);
        return 0;
      }
      imagetopnm_cold_3();
    }
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/bin/jp2/convert.c"
            ,0x7ef,OVar1);
  }
  return 1;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if ((prec = (int)image->comps[0].prec) > 16) {
        fprintf(stderr, "%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n", __FILE__, __LINE__, prec);
        return 1;
    }
    two = has_alpha = 0;
    fails = 1;
    ncomp = image->numcomps;

    while (*tmp) {
        ++tmp;
    }
    tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if (want_gray) {
        ncomp = 1;
    }

    if ((force_split == 0) && ncomp >= 2 &&
            are_comps_similar(image)) {
        fdest = fopen(outfile, "wb");

        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w;
        hr = (int)image->comps[0].h;
        max = (1 << prec) - 1;
        has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;
        if (red == NULL) {
            fprintf(stderr,
                    "imagetopnm: planes[%d] == NULL.\n", 0);
            fprintf(stderr, "\tAborting\n");
            fclose(fdest);
            return fails;
        }

        if (triple) {
            green = image->comps[1].data;
            blue = image->comps[2].data;
            for (i = 1; i <= 2; i++) {
                if (image->comps[i].data == NULL) {
                    fprintf(stderr,
                            "imagetopnm: planes[%d] == NULL.\n", i);
                    fprintf(stderr, "\tAborting\n");
                    fclose(fdest);
                    return fails;
                }
            }
        } else {
            green = blue = NULL;
        }

        if (has_alpha) {
            const char *tt = (triple ? "RGB_ALPHA" : "GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                       1 << (image->comps[ncomp - 1].prec - 1) : 0);
        } else {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if (triple) {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        } else {
            adjustG = adjustB = 0;
        }

        for (i = 0; i < wr * hr; ++i) {
            if (two) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (triple) {
                    v = *green + adjustG;
                    ++green;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                    v =  *blue + adjustB;
                    ++blue;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                }/* if(triple) */

                if (has_alpha) {
                    v = *alpha + adjustA;
                    ++alpha;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
                continue;

            }   /* if(two) */

            /* prec <= 8: */
            v = *red++;
            if (v > 255) {
                v = 255;
            } else if (v < 0) {
                v = 0;
            }

            fprintf(fdest, "%c", (unsigned char)v);
            if (triple) {
                v = *green++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
            if (has_alpha) {
                v = *alpha++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }   /* for(i */

        fclose(fdest);
        return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp) {
        fprintf(stderr, "WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr, "           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if (destname == NULL) {
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++) {
        if (ncomp > 1) {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            memcpy(destname, outfile, dotpos);
            sprintf(destname + dotpos, "_%u.pgm", compno);
        } else {
            sprintf(destname, "%s", outfile);
        }

        fdest = fopen(destname, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w;
        hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1 << prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        if (!red) {
            fclose(fdest);
            continue;
        }

        adjustR =
            (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if (prec > 8) {
            for (i = 0; i < wr * hr; i++) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (has_alpha) {
                    v = *alpha++;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
            }/* for(i */
        } else { /* prec <= 8 */
            for (i = 0; i < wr * hr; ++i) {
                v = *red + adjustR;
                ++red;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}